

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread.h
# Opt level: O1

int CreateDefaultThread(PTHREAD_PROC pThreadProc,void *pParam,THREAD_IDENTIFIER *pThreadId)

{
  int iVar1;
  int iVar2;
  sched_param param;
  pthread_attr_t attr;
  sched_param local_6c;
  pthread_attr_t local_68;
  
  iVar1 = pthread_attr_init(&local_68);
  if (iVar1 == 0) {
    iVar1 = pthread_attr_setstacksize(&local_68,0x100000);
    if (((iVar1 == 0) && (iVar1 = pthread_attr_setinheritsched(&local_68,1), iVar1 == 0)) &&
       (iVar1 = pthread_attr_setschedpolicy(&local_68,0), iVar1 == 0)) {
      local_6c.__sched_priority = 0;
      iVar1 = pthread_attr_setschedparam(&local_68,&local_6c);
      if (iVar1 == 0) {
        iVar1 = pthread_create(pThreadId,&local_68,(__start_routine *)pThreadProc,pParam);
        iVar2 = pthread_attr_destroy(&local_68);
        if (iVar1 != 0) {
          return 1;
        }
        if (iVar2 != 0) {
          pthread_detach(*pThreadId);
          pthread_cancel(*pThreadId);
          return 1;
        }
        return 0;
      }
    }
    pthread_attr_destroy(&local_68);
  }
  return 1;
}

Assistant:

inline int CreateDefaultThread(PTHREAD_PROC pThreadProc, void* pParam, THREAD_IDENTIFIER* pThreadId)
{
#ifdef _WIN32
	// CreateThread is not advised when used in combination with the C standard library...
	// But it is not clear whether it is a problem in our case...
#ifdef USE_CREATE_THREAD
	HANDLE hThread = CreateThread( 
		NULL, // Default security attributes.
		DEFAULT_THREAD_STACK_SIZE, // Initial size of the stack, in bytes.  
		pThreadProc, // Thread function. 
		pParam, // Argument to thread function. 
		0, // Use default creation flags. 
		pThreadId); // Returns the thread identifier. 

	if (hThread == NULL)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			pThreadProc, pParam));
		return EXIT_FAILURE;
	}
#else
	HANDLE hThread = (HANDLE)_beginthreadex( 
		NULL, // Default security attributes.
		DEFAULT_THREAD_STACK_SIZE, // Initial size of the stack, in bytes.  
		pThreadProc, // Thread function. 
		pParam, // Argument to thread function. 
		0, // Use default creation flags. 
		(unsigned int*)pThreadId); // Returns the thread identifier. 

	if (hThread == NULL)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			"_beginthreadex failed. ", 
			pThreadProc, pParam));
		return EXIT_FAILURE;
	}
#endif // USE_CREATE_THREAD

	// Close the thread handle (this does not terminate the thread and makes the handle 
	// returned by CreateThread() be closed automatically and invalid when the thread terminates,
	// if no other handles to it are opened. Anyway, all the resources used by the thread will
	// be released when it is terminated and all the handles to it are closed).
	if (!CloseHandle(hThread))
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			pThreadProc, pParam));
		return EXIT_FAILURE;
	}
#else
	pthread_attr_t attr;
	int policy = 0;
	struct sched_param param;
	//int prio_max = 0;
	//int prio_min = 0;

	// Initialize thread attribute.
	if (pthread_attr_init(&attr) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			"pthread_attr_init failed. ", 
			pThreadProc, pParam));
		return EXIT_FAILURE;
	}

	// Set a default stacksize.
	if (pthread_attr_setstacksize(&attr, DEFAULT_THREAD_STACK_SIZE) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			"pthread_attr_setstacksize failed. ", 
			pThreadProc, pParam));
		pthread_attr_destroy(&attr);
		return EXIT_FAILURE;
	}

	// Set the thread as joinable. This is the default on Linux. 
	//pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

#ifndef __ANDROID__
	// Indicate whether the scheduling policy and scheduling parameters for the 
	// newly created thread are determined by the values of the schedpolicy and 
	// schedparam attributes (value PTHREAD_EXPLICIT_SCHED) or are inherited from 
	// the parent thread (value PTHREAD_INHERIT_SCHED). 
	if (pthread_attr_setinheritsched(&attr, PTHREAD_EXPLICIT_SCHED) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			"pthread_attr_setinheritsched failed. ", 
			pThreadProc, pParam));
		pthread_attr_destroy(&attr);
		return EXIT_FAILURE;
	}
#endif // !__ANDROID__

	// Only PTHREAD_SCOPE_SYSTEM is supported on Linux. This is the default on Linux. 
	// That is a pity as PTHREAD_SCOPE_PROCESS seems to describe a behaviour similar 
	// to Windows threads and process for priorities but it is not clear...
	//if (pthread_attr_setscope(&attr, PTHREAD_SCOPE_PROCESS) != EXIT_SUCCESS)
	//{
	//	PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
	//		"(pThreadProc=%#x, pParam=%#x)\n", 
	//		strtime_m(), 
	//		"pthread_attr_setscope failed. ", 
	//		pThreadProc, pParam));
	//	pthread_attr_destroy(&attr);
	//	return EXIT_FAILURE;
	//}

	// Set the scheduling policy attribute of the thread. The supported values 
	// are SCHED_FIFO, SCHED_RR, and SCHED_OTHER.
	policy = SCHED_OTHER;
	if (pthread_attr_setschedpolicy(&attr, policy) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			"pthread_attr_setschedpolicy failed. ", 
			pThreadProc, pParam));
		pthread_attr_destroy(&attr);
		return EXIT_FAILURE;
	}

	// Set the priority of the thread.
	// For the SCHED_OTHER policy, sched_priority is not used in scheduling decisions 
	// (it must be specified as 0).
	param.sched_priority = 0;
	if (pthread_attr_setschedparam(&attr, &param) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			"pthread_attr_setschedparam failed. ", 
			pThreadProc, pParam));
		pthread_attr_destroy(&attr);
		return EXIT_FAILURE;
	}

	//// To retrieve the priorities in case of realtime scheduling policies.
	//pthread_attr_getschedpolicy(&attr, &policy);

	//prio_max = sched_get_priority_max(policy);
	//prio_min = sched_get_priority_min(policy);

	//PRINT_DEBUG_MESSAGE_OSTHREAD(("prio_min = %d\n", prio_min));
	//PRINT_DEBUG_MESSAGE_OSTHREAD(("prio_max = %d\n", prio_max));

	//// Maybe find better quantified values...
	//THREAD_PRIORITY_TIME_CRITICAL = prio_max;
	//THREAD_PRIORITY_HIGHEST = (prio_max-(prio_max+prio_min+1)/2)*2/3+(prio_max+prio_min+1)/2;
	//THREAD_PRIORITY_ABOVE_NORMAL = (prio_max-(prio_max+prio_min+1)/2)/3+(prio_max+prio_min+1)/2;
	//THREAD_PRIORITY_NORMAL = (prio_max+prio_min+1)/2;
	//THREAD_PRIORITY_BELOW_NORMAL = ((prio_max+prio_min+1)/2-prio_min)/2+prio_min;
	//THREAD_PRIORITY_LOWEST = prio_min;
	//THREAD_PRIORITY_IDLE = 0;
	//// 31 corresponds to THREAD_PRIORITY_TIME_CRITICAL-THREAD_PRIORITY_IDLE+1 
	//// (number of levels of priority) for Windows.
	//// Unix should have at least 32 distinct priority levels. 

	if (pthread_create(pThreadId, &attr, pThreadProc, pParam) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			"pthread_create failed. ", 
			pThreadProc, pParam));
		pthread_attr_destroy(&attr);
		return EXIT_FAILURE;
	}

	// Free attribute.
	if (pthread_attr_destroy(&attr) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSTHREAD(("CreateDefaultThread error (%s) : %s"
			"(pThreadProc=%#x, pParam=%#x)\n", 
			strtime_m(), 
			"pthread_attr_destroy failed. ", 
			pThreadProc, pParam));
		pthread_detach(*pThreadId);
#ifndef __ANDROID__
		pthread_cancel(*pThreadId);
#endif // !__ANDROID__
		return EXIT_FAILURE;
	}
#endif // _WIN32

	return EXIT_SUCCESS;
}